

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

shared_ptr<i1>
boost::ext::di::v1_3_0::scopes::instance::
scope<boost::ext::di::v1_3_0::aux::type_list<i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_int>
::
injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
::
create<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
::impl(injector__<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>
       *object)

{
  element_type *in_RDI;
  shared_ptr<i1> sVar1;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_stack_ffffffffffffffc8;
  
  core::
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
  ::
  create_successful_impl<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,std::shared_ptr<i1>>
            (in_stack_ffffffffffffffc8,(type<std::shared_ptr<i1>_> *)0x11d48e);
  sVar1 = core::successful::wrapper::operator_cast_to_shared_ptr
                    ((wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>_>
                      *)in_stack_ffffffffffffffc8);
  sVar1.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<i1>)sVar1.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static T impl(const injector__<named<TName, T>>* object) {
          using type = aux::type<aux::conditional_t<aux::is_same<TName, no_name>::value, T, named<TName, T>>>;
          return static_cast<const core::injector__<TInjector>&>(static_cast<const injector_impl*>(object)->injector_)
              .create_successful_impl(type{});
        }